

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_bloomshader.cpp
# Opt level: O0

void __thiscall FBloomExtractShader::Bind(FBloomExtractShader *this)

{
  bool bVar1;
  GLuint GVar2;
  FBloomExtractShader *this_local;
  
  bVar1 = FShaderProgram::operator_cast_to_bool(&this->mShader);
  if (!bVar1) {
    FShaderProgram::Compile(&this->mShader,Vertex,"shaders/glsl/screenquad.vp","",0x14a);
    FShaderProgram::Compile(&this->mShader,Fragment,"shaders/glsl/bloomextract.fp","",0x14a);
    FShaderProgram::SetFragDataLocation(&this->mShader,0,"FragColor");
    FShaderProgram::Link(&this->mShader,"shaders/glsl/bloomextract");
    FShaderProgram::SetAttribLocation(&this->mShader,0,"PositionInProjection");
    GVar2 = FShaderProgram::operator_cast_to_unsigned_int(&this->mShader);
    FBufferedUniformSampler::Init(&this->SceneTexture,GVar2,"SceneTexture");
    GVar2 = FShaderProgram::operator_cast_to_unsigned_int(&this->mShader);
    FBufferedUniform1f::Init(&this->Exposure,GVar2,"ExposureAdjustment");
    GVar2 = FShaderProgram::operator_cast_to_unsigned_int(&this->mShader);
    FBufferedUniform2f::Init(&this->Scale,GVar2,"Scale");
    GVar2 = FShaderProgram::operator_cast_to_unsigned_int(&this->mShader);
    FBufferedUniform2f::Init(&this->Offset,GVar2,"Offset");
  }
  FShaderProgram::Bind(&this->mShader);
  return;
}

Assistant:

void FBloomExtractShader::Bind()
{
	if (!mShader)
	{
		mShader.Compile(FShaderProgram::Vertex, "shaders/glsl/screenquad.vp", "", 330);
		mShader.Compile(FShaderProgram::Fragment, "shaders/glsl/bloomextract.fp", "", 330);
		mShader.SetFragDataLocation(0, "FragColor");
		mShader.Link("shaders/glsl/bloomextract");
		mShader.SetAttribLocation(0, "PositionInProjection");
		SceneTexture.Init(mShader, "SceneTexture");
		Exposure.Init(mShader, "ExposureAdjustment");
		Scale.Init(mShader, "Scale");
		Offset.Init(mShader, "Offset");
	}
	mShader.Bind();
}